

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

char * mp_encode_uint(char *data,uint64_t num)

{
  char *pcVar1;
  uint64_t num_local;
  char *data_local;
  
  if (num < 0x80) {
    data_local = mp_store_u8(data,(uint8_t)num);
  }
  else if (num < 0x100) {
    pcVar1 = mp_store_u8(data,0xcc);
    data_local = mp_store_u8(pcVar1,(uint8_t)num);
  }
  else if (num < 0x10000) {
    pcVar1 = mp_store_u8(data,0xcd);
    data_local = mp_store_u16(pcVar1,(uint16_t)num);
  }
  else if (num < 0x100000000) {
    pcVar1 = mp_store_u8(data,0xce);
    data_local = mp_store_u32(pcVar1,(uint32_t)num);
  }
  else {
    pcVar1 = mp_store_u8(data,0xcf);
    data_local = mp_store_u64(pcVar1,num);
  }
  return data_local;
}

Assistant:

MP_IMPL char *
mp_encode_uint(char *data, uint64_t num)
{
	if (num <= 0x7f) {
		return mp_store_u8(data, (uint8_t)num);
	} else if (num <= UINT8_MAX) {
		data = mp_store_u8(data, 0xcc);
		return mp_store_u8(data, (uint8_t)num);
	} else if (num <= UINT16_MAX) {
		data = mp_store_u8(data, 0xcd);
		return mp_store_u16(data, (uint16_t)num);
	} else if (num <= UINT32_MAX) {
		data = mp_store_u8(data, 0xce);
		return mp_store_u32(data, (uint32_t)num);
	} else {
		data = mp_store_u8(data, 0xcf);
		return mp_store_u64(data, num);
	}
}